

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall kj::StringTree::fill(StringTree *this,char *pos,size_t branchIndex)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long *in_R8;
  bool bVar4;
  long local_50;
  undefined1 local_41;
  long local_40;
  String local_38;
  size_t local_20;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  local_20 = branchIndex;
  branchIndex_local = (size_t)pos;
  pos_local = (char *)this;
  pcVar1 = String::end(&this->text);
  sVar3 = local_20;
  bVar4 = false;
  if (pos == pcVar1) {
    sVar2 = Array<kj::StringTree::Branch>::size(&this->branches);
    bVar4 = sVar3 == sVar2;
  }
  if (!bVar4) {
    pcVar1 = String::end(&this->text);
    local_40 = (long)pcVar1 - branchIndex_local;
    local_41 = 0x20;
    sVar3 = Array<kj::StringTree::Branch>::size(&this->branches);
    local_50 = sVar3 - local_20;
    str<long,char,unsigned_long>
              (&local_38,(kj *)&local_40,(long *)&local_41,(char *)&local_50,in_R8);
    pcVar1 = String::cStr(&local_38);
    _::inlineRequireFailure
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/string-tree.h"
               ,0xb3,"pos == text.end() && branchIndex == branches.size()",
               "kj::str(text.end() - pos, \' \', branches.size() - branchIndex).cStr()",pcVar1);
  }
  return;
}

Assistant:

inline void StringTree::fill(char* pos, size_t branchIndex) {
  KJ_IREQUIRE(pos == text.end() && branchIndex == branches.size(),
              kj::str(text.end() - pos, ' ', branches.size() - branchIndex).cStr());
}